

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::SerializeToString(UnknownFieldSet *this,string *output)

{
  size_t new_size;
  uint8_t *target;
  size_t size;
  string *output_local;
  UnknownFieldSet *this_local;
  
  new_size = internal::WireFormat::ComputeUnknownFieldsSize(this);
  absl::lts_20250127::strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>
            (output,new_size);
  target = (uint8_t *)std::__cxx11::string::data();
  internal::WireFormat::SerializeUnknownFieldsToArray(this,target);
  return true;
}

Assistant:

bool UnknownFieldSet::SerializeToString(std::string* output) const {
  const size_t size =
      google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(*this);
  absl::strings_internal::STLStringResizeUninitializedAmortized(output, size);
  google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
      *this, reinterpret_cast<uint8_t*>(const_cast<char*>(output->data())));
  return true;
}